

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerBailOnTrue(Lowerer *this,Instr *instr,LabelInstr *labelBailOut)

{
  Instr *pIVar1;
  LabelInstr *target;
  RegOpnd *dst;
  Opnd *src;
  
  pIVar1 = instr->m_prev;
  target = IR::Instr::GetOrCreateContinueLabel(instr,false);
  dst = IR::RegOpnd::New(instr->m_src1->m_type,this->m_func);
  src = IR::Instr::UnlinkSrc1(instr);
  InsertMove(&dst->super_Opnd,src,instr,true);
  InsertTest(&dst->super_Opnd,&dst->super_Opnd,instr);
  InsertBranch(BrEq_A,false,target,instr);
  GenerateBailOut(this,instr,(BranchInstr *)0x0,labelBailOut,(LabelInstr *)0x0);
  return pIVar1;
}

Assistant:

IR::Instr*
Lowerer::LowerBailOnTrue(IR::Instr* instr, IR::LabelInstr* labelBailOut /*nullptr*/)
{
    IR::Instr* instrPrev = instr->m_prev;

    IR::LabelInstr* continueLabel = instr->GetOrCreateContinueLabel();
    IR::RegOpnd * regSrc1 = IR::RegOpnd::New(instr->GetSrc1()->GetType(), this->m_func);
    InsertMove(regSrc1, instr->UnlinkSrc1(), instr);
    InsertTestBranch(regSrc1, regSrc1, Js::OpCode::BrEq_A, continueLabel, instr);

    GenerateBailOut(instr, nullptr, labelBailOut);

    return instrPrev;
}